

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::PackSnorm2x16Case::iterate(PackSnorm2x16Case *this)

{
  ulong uVar1;
  Precision PVar2;
  ShaderExecutor *pSVar3;
  deUint32 dVar4;
  uint uVar5;
  char *description;
  int iVar6;
  ostringstream *poVar7;
  uint uVar8;
  PackSnorm2x16Case *pPVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  float fVar22;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  float local_228 [2];
  long lStack_220;
  long local_218;
  PackSnorm2x16Case *local_210;
  Hex<8UL> local_208;
  int local_1fc;
  undefined8 local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  ulong local_1d0;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  undefined1 auVar20 [16];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar4 ^ 0x776002);
  local_218 = 0;
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  lStack_220 = 0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar2 = this->m_precision;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar5 = 0x21;
  }
  else {
    uVar5 = 1;
    if ((PVar2 != PRECISION_HIGHP) && (uVar5 = 0x81, PVar2 != PRECISION_LOWP)) {
      uVar5 = 0;
    }
  }
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  local_210 = this;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -1.0;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = -0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -1.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = -0.75;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  iVar6 = 0xf;
  do {
    fVar16 = deRandom_getFloat(&local_1c0);
    local_1f8 = (pointer)CONCAT44(extraout_XMM0_Db,fVar16);
    fVar16 = deRandom_getFloat(&local_1c0);
    local_1b0._0_4_ = (float)local_1f8 * 2.5 + -1.25;
    local_1b0._4_4_ = fVar16 * 2.5 + -1.25;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
               (Vector<float,_2> *)local_1b0);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0x50;
  do {
    fVar16 = deRandom_getFloat(&local_1c0);
    local_1f8 = (pointer)CONCAT44(extraout_XMM0_Db_00,fVar16);
    fVar16 = deRandom_getFloat(&local_1c0);
    local_1b0._0_4_ = (float)local_1f8 * 1e+06 + -500000.0;
    local_1b0._4_4_ = fVar16 * 1e+06 + -500000.0;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
               (Vector<float,_2> *)local_1b0);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1e8,lStack_220 - (long)local_228 >> 3);
  local_1b0._0_8_ =
       ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar7 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar7);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  pPVar9 = local_210;
  local_1b0._0_4_ = local_228[0];
  local_1b0._4_4_ = local_228[1];
  local_208.value =
       (deUint64)
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((local_210->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar3 = (pPVar9->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar3->_vptr_ShaderExecutor[6])
            (pSVar3,(ulong)(lStack_220 - (long)local_228) >> 3,local_1b0,&local_208);
  local_1d0 = (ulong)(lStack_220 - (long)local_228) >> 3;
  pPVar9 = local_210;
  if ((int)(uint)local_1d0 < 1) {
    iVar6 = 0;
  }
  else {
    uVar10 = (ulong)((uint)local_1d0 & 0x7fffffff);
    uVar11 = 0;
    iVar6 = 0;
    local_1c8 = uVar10;
    do {
      poVar7 = (ostringstream *)(local_1b0 + 8);
      uVar1 = *(ulong *)((long)local_228 + uVar11 * 8);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar1;
      auVar19 = minps(ZEXT816(0x3f8000003f800000),auVar19);
      uVar12 = -(uint)((float)uVar1 < -1.0);
      uVar14 = -(uint)((float)(uVar1 >> 0x20) < -1.0);
      fVar16 = (float)(uVar12 & 0xc6fffe00 | ~uVar12 & (uint)(auVar19._0_4_ * 32767.0));
      fVar17 = (float)(uVar14 & 0xc6fffe00 | ~uVar14 & (uint)(auVar19._4_4_ * 32767.0));
      iVar13 = -(uint)(fVar16 < 0.0);
      iVar15 = -(uint)(fVar17 < 0.0);
      auVar21._4_4_ = iVar15;
      auVar21._0_4_ = iVar13;
      auVar21._8_4_ = iVar15;
      auVar21._12_4_ = iVar15;
      auVar20._8_8_ = auVar21._8_8_;
      auVar20._4_4_ = iVar13;
      auVar20._0_4_ = iVar13;
      uVar12 = movmskpd(local_228[0],auVar20);
      fVar18 = -0.5;
      if ((uVar12 & 1) == 0) {
        fVar18 = 0.5;
      }
      fVar22 = -0.5;
      if ((uVar12 & 2) == 0) {
        fVar22 = 0.5;
      }
      fVar18 = fVar18 + fVar16;
      fVar16 = -32768.0;
      if (-32768.0 <= fVar18) {
        fVar16 = fVar18;
      }
      fVar18 = 32767.0;
      if (fVar16 <= 32767.0) {
        fVar18 = fVar16;
      }
      fVar17 = fVar17 + fVar22;
      fVar16 = -32768.0;
      if (-32768.0 <= fVar17) {
        fVar16 = fVar17;
      }
      fVar17 = 32767.0;
      if (fVar16 <= 32767.0) {
        fVar17 = fVar16;
      }
      uVar12 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      local_1f8 = (pointer)(ulong)uVar12;
      uVar8 = ((int)fVar18 & 0xffffU) - (uVar12 & 0xffff);
      uVar14 = -uVar8;
      if (0 < (int)uVar8) {
        uVar14 = uVar8;
      }
      uVar8 = ((int)fVar17 & 0xffffU) - (uVar12 >> 0x10);
      uVar12 = -uVar8;
      if (0 < (int)uVar8) {
        uVar12 = uVar8;
      }
      if ((uVar5 < uVar14) || (uVar5 < uVar12)) {
        if (iVar6 < 10) {
          local_1b0._0_8_ =
               ((pPVar9->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar7 = (ostringstream *)(local_1b0 + 8);
          local_1fc = iVar6;
          std::__cxx11::ostringstream::ostringstream(poVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar7,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar7,(int)uVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar7,", expected packSnorm2x16(",0x19);
          tcu::operator<<((ostream *)poVar7,(Vector<float,_2> *)(uVar11 * 8 + (long)local_228));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,") = ",4);
          local_208.value = (deUint64)((int)fVar17 << 0x10 | (int)fVar18 & 0xffffU);
          tcu::Format::Hex<8UL>::toStream(&local_208,(ostream *)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,", got ",6);
          local_208.value = (deUint64)local_1f8;
          tcu::Format::Hex<8UL>::toStream(&local_208,(ostream *)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n  diffs = (",0xc);
          std::ostream::operator<<(poVar7,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,", ",2);
          std::ostream::operator<<(poVar7,uVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"), max diff = ",0xe)
          ;
          std::ostream::operator<<(poVar7,uVar5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar7);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          pPVar9 = local_210;
          uVar10 = local_1c8;
          iVar6 = local_1fc;
        }
        else if (iVar6 == 10) {
          local_1b0._0_8_ =
               ((pPVar9->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar7);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          pPVar9 = local_210;
          uVar10 = local_1c8;
        }
        iVar6 = iVar6 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  local_1b0._0_8_ =
       ((pPVar9->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar7 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar7);
  std::ostream::operator<<(poVar7,(int)local_1d0 - iVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," / ",3);
  std::ostream::operator<<(poVar7,(int)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar7);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  description = "Pass";
  if (iVar6 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,(uint)(iVar6 != 0),description);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228 != (float  [2])0x0) {
    operator_delete((void *)local_228,local_218 - (long)local_228);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}